

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::FCDUTF16CollationIterator::FCDUTF16CollationIterator
          (FCDUTF16CollationIterator *this,FCDUTF16CollationIterator *other,UChar *newText)

{
  UChar *pUVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  UChar *local_68;
  UChar *local_58;
  UChar *local_48;
  UChar *newText_local;
  FCDUTF16CollationIterator *other_local;
  FCDUTF16CollationIterator *this_local;
  
  UTF16CollationIterator::UTF16CollationIterator
            (&this->super_UTF16CollationIterator,&other->super_UTF16CollationIterator);
  (this->super_UTF16CollationIterator).super_CollationIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16CollationIterator_004aade0;
  this->rawStart = newText;
  this->segmentStart = newText + ((long)other->segmentStart - (long)other->rawStart >> 1);
  if (other->segmentLimit == (UChar *)0x0) {
    local_48 = (UChar *)0x0;
  }
  else {
    local_48 = newText + ((long)other->segmentLimit - (long)other->rawStart >> 1);
  }
  this->segmentLimit = local_48;
  if (other->rawLimit == (UChar *)0x0) {
    local_58 = (UChar *)0x0;
  }
  else {
    local_58 = newText + ((long)other->rawLimit - (long)other->rawStart >> 1);
  }
  this->rawLimit = local_58;
  this->nfcImpl = other->nfcImpl;
  UnicodeString::UnicodeString(&this->normalized,&other->normalized);
  this->checkDir = other->checkDir;
  if ((this->checkDir == '\0') &&
     ((other->super_UTF16CollationIterator).start != other->segmentStart)) {
    pcVar3 = UnicodeString::getBuffer(&this->normalized);
    (this->super_UTF16CollationIterator).start = pcVar3;
    (this->super_UTF16CollationIterator).pos =
         (UChar *)((long)(this->super_UTF16CollationIterator).start +
                  ((long)(other->super_UTF16CollationIterator).pos -
                  (long)(other->super_UTF16CollationIterator).start));
    pUVar1 = (this->super_UTF16CollationIterator).start;
    iVar2 = UnicodeString::length(&this->normalized);
    (this->super_UTF16CollationIterator).limit = pUVar1 + iVar2;
  }
  else {
    (this->super_UTF16CollationIterator).start =
         newText + ((long)(other->super_UTF16CollationIterator).start - (long)other->rawStart >> 1);
    (this->super_UTF16CollationIterator).pos =
         newText + ((long)(other->super_UTF16CollationIterator).pos - (long)other->rawStart >> 1);
    if ((other->super_UTF16CollationIterator).limit == (UChar *)0x0) {
      local_68 = (UChar *)0x0;
    }
    else {
      local_68 = newText + ((long)(other->super_UTF16CollationIterator).limit -
                            (long)other->rawStart >> 1);
    }
    (this->super_UTF16CollationIterator).limit = local_68;
  }
  return;
}

Assistant:

FCDUTF16CollationIterator::FCDUTF16CollationIterator(const FCDUTF16CollationIterator &other,
                                                     const UChar *newText)
        : UTF16CollationIterator(other),
          rawStart(newText),
          segmentStart(newText + (other.segmentStart - other.rawStart)),
          segmentLimit(other.segmentLimit == NULL ? NULL : newText + (other.segmentLimit - other.rawStart)),
          rawLimit(other.rawLimit == NULL ? NULL : newText + (other.rawLimit - other.rawStart)),
          nfcImpl(other.nfcImpl),
          normalized(other.normalized),
          checkDir(other.checkDir) {
    if(checkDir != 0 || other.start == other.segmentStart) {
        start = newText + (other.start - other.rawStart);
        pos = newText + (other.pos - other.rawStart);
        limit = other.limit == NULL ? NULL : newText + (other.limit - other.rawStart);
    } else {
        start = normalized.getBuffer();
        pos = start + (other.pos - other.start);
        limit = start + normalized.length();
    }
}